

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O1

cbtVector3 __thiscall
cbt2DarcShape::localGetSupportingVertexWithoutMargin(cbt2DarcShape *this,cbtVector3 *vec0)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  cbtVector3 cVar8;
  
  fVar2 = 0.0 - *(float *)&(this->super_cbtConvexInternalShape).field_0x44;
  fVar3 = 0.0 - this->y;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar2))
  ;
  if (auVar4._0_4_ < 0.0) {
    fVar6 = sqrtf(auVar4._0_4_);
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar6 = auVar4._0_4_;
  }
  fVar6 = 1.0 / fVar6;
  fVar1 = this->radius;
  auVar4 = vinsertps_avx(ZEXT416((uint)(fVar1 * fVar2 * fVar6)),
                         ZEXT416((uint)(fVar1 * fVar3 * fVar6)),0x10);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar7._4_12_ = SUB1612(auVar5 << 0x40,4);
  auVar7._0_4_ = fVar1 * fVar6 * 0.0;
  cVar8.m_floats._0_8_ = auVar4._0_8_;
  cVar8.m_floats._8_8_ = auVar7._0_8_;
  return (cbtVector3)cVar8.m_floats;
}

Assistant:

cbtVector3	cbt2DarcShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0)const
{
	cbtVector3 supVec(0,0,0);
	
    cbtVector3 O1(x,y,0);
	
    cbtVector3 D( supVec-O1 );
    D.normalize();

    supVec = D * radius;

	return supVec;
}